

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Kriging.cpp
# Opt level: O1

tuple<double,_arma::Col<double>_> * __thiscall
Kriging::leaveOneOutFun
          (tuple<double,_arma::Col<double>_> *__return_storage_ptr__,Kriging *this,vec *_theta,
          bool _grad,bool _bench)

{
  uword uVar1;
  uword uVar2;
  uword uVar3;
  uword uVar4;
  uhword uVar5;
  uint uVar6;
  double *pdVar7;
  bool bVar8;
  char (*pacVar9) [39];
  undefined3 in_register_00000081;
  ulong uVar10;
  undefined1 auVar11 [16];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  bench;
  Mat<double> local_758;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  local_6a8;
  KModel local_678;
  
  local_758.n_rows = 0;
  local_758.n_cols = 1;
  local_758.n_elem = 0;
  local_758.n_alloc = 0;
  local_758.vec_state = 1;
  local_758.mem_state = 0;
  local_758.mem = (double *)0x0;
  if (CONCAT31(in_register_00000081,_bench) == 0) {
    if (!_grad) goto LAB_00136562;
    local_678.R.n_rows = (_theta->super_Mat<double>).n_elem;
    pdVar7 = (double *)(ulong)local_678.R.n_rows;
    local_678.R.n_cols = 1;
    local_678.R.n_alloc = 0;
    local_678.R.vec_state = 1;
    local_678.R.mem_state = 0;
    local_678.R.mem = (double *)0x0;
    local_678.R.n_elem = local_678.R.n_rows;
    if (pdVar7 < (double *)0x11) {
      if (pdVar7 != (double *)0x0) {
        pdVar7 = local_678.R.mem_local;
      }
      uVar6 = 0;
    }
    else {
      pacVar9 = (char (*) [39])((long)pdVar7 << 3);
      pdVar7 = (double *)lkalloc::malloc((size_t)pacVar9);
      uVar6 = local_678.R.n_elem;
      if (pdVar7 == (double *)0x0) {
        arma::arma_stop_bad_alloc<char[39]>(pacVar9);
      }
    }
    local_678.R.mem = pdVar7;
    local_678.R.n_alloc = uVar6;
    if ((ulong)local_678.R.n_elem != 0) {
      memset(local_678.R.mem,0,(ulong)local_678.R.n_elem << 3);
    }
    uVar5 = local_678.R.mem_state;
    uVar4 = local_678.R.n_alloc;
    uVar3 = local_678.R.n_elem;
    uVar2 = local_678.R.n_cols;
    uVar1 = local_678.R.n_rows;
    bVar8 = true;
    if ((local_758.vec_state != local_678.R.vec_state) &&
       (local_758.vec_state != 1 || local_678.R.n_cols != 1)) {
      bVar8 = local_678.R.n_rows == 1 && local_758.vec_state == 2;
    }
    uVar6 = (uint)local_678.R.vec_state;
    if (((bVar8) && (local_758.mem_state < 2)) &&
       ((ushort)(local_678.R.mem_state - 1) < 2 || 0x10 < local_678.R.n_alloc)) {
      arma::Mat<double>::init_warm
                (&local_758,(uint)(local_758.vec_state == 2),(uint)(local_758.vec_state == 1));
      local_758.n_rows = uVar1;
      local_758.n_cols = uVar2;
      local_758.n_elem = uVar3;
      local_758.n_alloc = uVar4;
      local_758.mem_state = uVar5;
      auVar11 = pshuflw(ZEXT416(uVar6),ZEXT416(uVar6),0);
      uVar10 = CONCAT26(-(ushort)(auVar11._6_2_ == 0),
                        CONCAT24(-(ushort)(auVar11._4_2_ == 1),
                                 CONCAT22(-(ushort)(auVar11._2_2_ == 1),
                                          -(ushort)(auVar11._0_2_ == 2)))) & (ulong)DAT_001a3290;
      local_758.mem = local_678.R.mem;
      local_678.R.n_rows = (uword)uVar10;
      local_678.R.n_cols = (uword)(uVar10 >> 0x20);
      local_678.R.n_alloc = 0;
      local_678.R.mem_state = 0;
LAB_0013653a:
      local_678.R.n_elem = 0;
      local_678.R.mem = (double *)0x0;
    }
    else {
      arma::Mat<double>::init_warm(&local_758,local_678.R.n_rows,local_678.R.n_cols);
      if (local_758.mem != local_678.R.mem && (ulong)local_678.R.n_elem != 0) {
        memcpy(local_758.mem,local_678.R.mem,(ulong)local_678.R.n_elem << 3);
      }
      if (uVar4 < 0x11 && uVar5 == 0) {
        auVar11 = pshuflw(ZEXT416(uVar6),ZEXT416(uVar6),0);
        uVar10 = CONCAT26(-(ushort)(auVar11._6_2_ == 0),
                          CONCAT24(-(ushort)(auVar11._4_2_ == 1),
                                   CONCAT22(-(ushort)(auVar11._2_2_ == 1),
                                            -(ushort)(auVar11._0_2_ == 2)))) & (ulong)DAT_001a3290;
        local_678.R.n_rows = (uword)uVar10;
        local_678.R.n_cols = (uword)(uVar10 >> 0x20);
        goto LAB_0013653a;
      }
    }
    if ((local_678.R.n_alloc != 0) && (local_678.R.mem != (double *)0x0)) {
      lkalloc::free(local_678.R.mem);
    }
LAB_00136562:
    make_Model(&local_678,this,_theta,
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                *)0x0);
  }
  local_6a8._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_6a8._M_t._M_impl.super__Rb_tree_header._M_header;
  local_6a8._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_6a8._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_6a8._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_6a8._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_6a8._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if (!_grad) goto LAB_001364a6;
  local_678.R.n_rows = (_theta->super_Mat<double>).n_elem;
  pdVar7 = (double *)(ulong)local_678.R.n_rows;
  local_678.R.n_cols = 1;
  local_678.R.n_alloc = 0;
  local_678.R.vec_state = 1;
  local_678.R.mem_state = 0;
  local_678.R.mem = (double *)0x0;
  local_678.R.n_elem = local_678.R.n_rows;
  if (pdVar7 < (double *)0x11) {
    if (pdVar7 != (double *)0x0) {
      pdVar7 = local_678.R.mem_local;
    }
    uVar6 = 0;
  }
  else {
    pacVar9 = (char (*) [39])((long)pdVar7 << 3);
    pdVar7 = (double *)lkalloc::malloc((size_t)pacVar9);
    uVar6 = local_678.R.n_elem;
    if (pdVar7 == (double *)0x0) {
      arma::arma_stop_bad_alloc<char[39]>(pacVar9);
    }
  }
  local_678.R.mem = pdVar7;
  local_678.R.n_alloc = uVar6;
  if ((ulong)local_678.R.n_elem != 0) {
    memset(local_678.R.mem,0,(ulong)local_678.R.n_elem << 3);
  }
  uVar5 = local_678.R.mem_state;
  uVar4 = local_678.R.n_alloc;
  uVar3 = local_678.R.n_elem;
  uVar2 = local_678.R.n_cols;
  uVar1 = local_678.R.n_rows;
  bVar8 = true;
  if ((local_758.vec_state != local_678.R.vec_state) &&
     (local_758.vec_state != 1 || local_678.R.n_cols != 1)) {
    bVar8 = local_678.R.n_rows == 1 && local_758.vec_state == 2;
  }
  uVar6 = (uint)local_678.R.vec_state;
  if (((bVar8) && (local_758.mem_state < 2)) &&
     ((ushort)(local_678.R.mem_state - 1) < 2 || 0x10 < local_678.R.n_alloc)) {
    arma::Mat<double>::init_warm
              (&local_758,(uint)(local_758.vec_state == 2),(uint)(local_758.vec_state == 1));
    local_758.n_rows = uVar1;
    local_758.n_cols = uVar2;
    local_758.n_elem = uVar3;
    local_758.n_alloc = uVar4;
    local_758.mem_state = uVar5;
    auVar11 = pshuflw(ZEXT416(uVar6),ZEXT416(uVar6),0);
    uVar10 = CONCAT26(-(ushort)(auVar11._6_2_ == 0),
                      CONCAT24(-(ushort)(auVar11._4_2_ == 1),
                               CONCAT22(-(ushort)(auVar11._2_2_ == 1),-(ushort)(auVar11._0_2_ == 2))
                              )) & (ulong)DAT_001a3290;
    local_758.mem = local_678.R.mem;
    local_678.R.n_rows = (uword)uVar10;
    local_678.R.n_cols = (uword)(uVar10 >> 0x20);
    local_678.R.n_alloc = 0;
    local_678.R.mem_state = 0;
LAB_0013647e:
    local_678.R.n_elem = 0;
    local_678.R.mem = (double *)0x0;
  }
  else {
    arma::Mat<double>::init_warm(&local_758,local_678.R.n_rows,local_678.R.n_cols);
    if (local_758.mem != local_678.R.mem && (ulong)local_678.R.n_elem != 0) {
      memcpy(local_758.mem,local_678.R.mem,(ulong)local_678.R.n_elem << 3);
    }
    if (uVar4 < 0x11 && uVar5 == 0) {
      auVar11 = pshuflw(ZEXT416(uVar6),ZEXT416(uVar6),0);
      uVar10 = CONCAT26(-(ushort)(auVar11._6_2_ == 0),
                        CONCAT24(-(ushort)(auVar11._4_2_ == 1),
                                 CONCAT22(-(ushort)(auVar11._2_2_ == 1),
                                          -(ushort)(auVar11._0_2_ == 2)))) & (ulong)DAT_001a3290;
      local_678.R.n_rows = (uword)uVar10;
      local_678.R.n_cols = (uword)(uVar10 >> 0x20);
      goto LAB_0013647e;
    }
  }
  if ((local_678.R.n_alloc != 0) && (local_678.R.mem != (double *)0x0)) {
    lkalloc::free(local_678.R.mem);
  }
LAB_001364a6:
  make_Model(&local_678,this,_theta,&local_6a8);
}

Assistant:

LIBKRIGING_EXPORT std::tuple<double, arma::vec> Kriging::leaveOneOutFun(const arma::vec& _theta,
                                                                        const bool _grad,
                                                                        const bool _bench) {
  double loo = -1;
  arma::vec grad;

  if (_bench) {
    std::map<std::string, double> bench;
    if (_grad) {
      grad = arma::vec(_theta.n_elem);
      loo = _leaveOneOut(_theta, &grad, nullptr, nullptr, &bench);
    } else
      loo = _leaveOneOut(_theta, nullptr, nullptr, nullptr, &bench);

    size_t num = 0;
    for (auto& kv : bench)
      num = std::max(kv.first.size(), num);
    for (auto& kv : bench)
      arma::cout << "| " << Bench::pad(kv.first, num, ' ') << " | " << kv.second << " |" << arma::endl;

  } else {
    if (_grad) {
      grad = arma::vec(_theta.n_elem);
      loo = _leaveOneOut(_theta, &grad, nullptr, nullptr, nullptr);
    } else
      loo = _leaveOneOut(_theta, nullptr, nullptr, nullptr, nullptr);
  }

  return std::make_tuple(loo, std::move(grad));
}